

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void disable_inter_references_except_altref(_Bool (*ref_combo) [9])

{
  _Bool (*in_RDI) [9];
  
  disable_reference('\x01',in_RDI);
  disable_reference('\x02',in_RDI);
  disable_reference('\x03',in_RDI);
  disable_reference('\x04',in_RDI);
  disable_reference('\x05',in_RDI);
  disable_reference('\x06',in_RDI);
  return;
}

Assistant:

static inline void disable_inter_references_except_altref(
    bool ref_combo[REF_FRAMES][REF_FRAMES + 1]) {
  disable_reference(LAST_FRAME, ref_combo);
  disable_reference(LAST2_FRAME, ref_combo);
  disable_reference(LAST3_FRAME, ref_combo);
  disable_reference(GOLDEN_FRAME, ref_combo);
  disable_reference(BWDREF_FRAME, ref_combo);
  disable_reference(ALTREF2_FRAME, ref_combo);
}